

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_subgraph.cc
# Opt level: O2

CommonSubgraphResult *
gss::solve_common_subgraph_problem
          (CommonSubgraphResult *__return_storage_ptr__,InputGraph *first,InputGraph *second,
          CommonSubgraphParams *params)

{
  pointer *pppVar1;
  pointer *pppVar2;
  _Rb_tree_header *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  element_type *peVar6;
  pointer ptVar7;
  function<gss::innards::SVOBitset_(int,_const_std::function<int_(int)>_&)> fVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  SearchResult SVar17;
  mapped_type *pmVar18;
  long lVar19;
  _Base_ptr p_Var20;
  UnsupportedConfiguration *this;
  ulong uVar21;
  pointer ppVar22;
  ulong uVar23;
  uint i;
  int iVar24;
  uint b;
  __shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> *__args;
  pointer ppVar25;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_00;
  string_view sVar26;
  string_view sVar27;
  shared_ptr<gss::innards::Proof> proof;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> assoc_encoding;
  undefined8 uStack_220;
  vector<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
  solution;
  __shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> local_1e0;
  SplitDomains domains;
  int local_1ac;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> zero_in_proof_objectives;
  undefined8 uStack_190;
  CliqueResult clique_result;
  vector<int,_std::allocator<int>_> permitted;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f0;
  undefined8 local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [16];
  _Base_ptr p_Stack_b8;
  _Base_ptr p_Stack_b0;
  bool local_60;
  __shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> local_58;
  bool local_48;
  _Optional_payload_base<int> local_44;
  
  if ((params->count_solutions == true) &&
     ((params->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == false)) {
    this = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&permitted,"Solution counting only makes sense for decision problems",
               (allocator<char> *)&clique_result);
    UnsupportedConfiguration::UnsupportedConfiguration(this,(string *)&permitted);
    __cxa_throw(this,&UnsupportedConfiguration::typeinfo,
                UnsupportedConfiguration::~UnsupportedConfiguration);
  }
  proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((params->proof_options).super__Optional_base<gss::ProofOptions,_false,_false>._M_payload.
      super__Optional_payload<gss::ProofOptions,_true,_false,_false>.
      super__Optional_payload_base<gss::ProofOptions>._M_engaged == true) {
    std::make_shared<gss::innards::Proof,gss::ProofOptions_const&>((ProofOptions *)&permitted);
    std::__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> *)&permitted);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    for (iVar24 = 0; iVar12 = InputGraph::size(first),
        peVar6 = proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        iVar24 < iVar12; iVar24 = iVar24 + 1) {
      iVar12 = InputGraph::size(second);
      clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      aStack_f0._0_8_ =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/common_subgraph.cc:365:17)>
           ::_M_invoke;
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._8_16_
           = ZEXT816(0x1153b2) << 0x40;
      clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/common_subgraph.cc:366:17)>
           ::_M_invoke;
      clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/common_subgraph.cc:366:17)>
           ::_M_manager;
      clique_result.clique._M_t._M_impl._0_8_ = second;
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)first;
      innards::Proof::create_cp_variable
                (peVar6,iVar24,iVar12 + 1,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                  *)&permitted,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                  *)&clique_result);
      std::_Function_base::~_Function_base((_Function_base *)&clique_result);
      std::_Function_base::~_Function_base((_Function_base *)&permitted);
    }
    iVar24 = InputGraph::size(first);
    iVar12 = InputGraph::size(second);
    uVar23 = (ulong)(params->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_engaged;
    uVar21 = (ulong)(params->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_payload._M_value;
    if (uVar23 == 0) {
      uVar21 = 0;
    }
    innards::Proof::create_null_decision_bound
              (peVar6,iVar24,iVar12,(optional<int>)(uVar21 | uVar23 << 0x20));
    peVar6 = proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar24 = InputGraph::size(first);
    iVar12 = InputGraph::size(second);
    innards::Proof::create_injectivity_constraints(peVar6,iVar24,iVar12);
    for (iVar24 = 0; iVar12 = InputGraph::size(first),
        peVar6 = proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        iVar24 < iVar12; iVar24 = iVar24 + 1) {
      for (iVar12 = 0; iVar13 = InputGraph::size(second), iVar12 < iVar13; iVar12 = iVar12 + 1) {
        bVar9 = InputGraph::adjacent(first,iVar24,iVar24);
        bVar10 = InputGraph::adjacent(second,iVar12,iVar12);
        if (bVar9 == bVar10) {
          sVar26 = InputGraph::vertex_label(first,iVar24);
          sVar27 = InputGraph::vertex_label(second,iVar12);
          bVar9 = std::operator==(sVar26,sVar27);
          if (!bVar9) goto LAB_001135d0;
          innards::Proof::start_adjacency_constraints_for
                    (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,iVar24,iVar12);
          for (iVar13 = 0; iVar14 = InputGraph::size(first), iVar13 < iVar14; iVar13 = iVar13 + 1) {
            if (iVar13 != iVar24) {
              iVar14 = 0;
              permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._8_16_ = ZEXT816(0);
              while( true ) {
                clique_result.clique._M_t._M_impl._0_4_ = iVar14;
                iVar15 = InputGraph::size(second);
                if (iVar15 <= iVar14) break;
                if (iVar12 != clique_result.clique._M_t._M_impl._0_4_) {
                  bVar9 = InputGraph::adjacent(first,iVar24,iVar13);
                  bVar10 = InputGraph::adjacent
                                     (second,iVar12,clique_result.clique._M_t._M_impl._0_4_);
                  if (bVar9 == bVar10) {
                    std::vector<int,_std::allocator<int>_>::push_back
                              (&permitted,(value_type_conflict1 *)&clique_result);
                  }
                }
                iVar14 = clique_result.clique._M_t._M_impl._0_4_ + 1;
              }
              iVar14 = InputGraph::size(second);
              clique_result.clique._M_t._M_impl._0_4_ = iVar14;
              std::vector<int,_std::allocator<int>_>::emplace_back<int>
                        ((vector<int,_std::allocator<int>_> *)
                         &permitted.super__Vector_base<int,_std::allocator<int>_>,
                         (int *)&clique_result);
              clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              clique_result.clique._M_t._M_impl._0_8_ = 0;
              clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
              innards::Proof::create_adjacency_constraint
                        (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,iVar24,iVar13,iVar12,
                         (vector<int,_std::allocator<int>_> *)
                         &permitted.super__Vector_base<int,_std::allocator<int>_>,
                         (vector<int,_std::allocator<int>_> *)&clique_result,false);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&clique_result);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&permitted.super__Vector_base<int,_std::allocator<int>_>);
            }
          }
        }
        else {
LAB_001135d0:
          innards::Proof::create_forbidden_assignment_constraint
                    (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,iVar24,iVar12);
        }
      }
    }
    if (params->connected != false) {
      iVar24 = InputGraph::size(first);
      iVar12 = InputGraph::size(second);
      aStack_f0._0_8_ =
           std::
           _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/common_subgraph.cc:401:78)>
           ::_M_invoke;
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._8_16_
           = ZEXT816(0x115456) << 0x40;
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)first;
      innards::Proof::create_connected_constraints
                (peVar6,iVar24,iVar12,(function<bool_(int,_int)> *)&permitted);
      std::_Function_base::~_Function_base((_Function_base *)&permitted);
    }
    innards::Proof::finalise_model
              (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if ((params->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == false) {
      pppVar1 = &assoc_encoding.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      pppVar2 = &zero_in_proof_objectives.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      iVar24 = 0;
      solution.
      super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      solution.
      super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      solution.
      super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      while( true ) {
        iVar12 = InputGraph::size(first);
        if (iVar12 <= iVar24) break;
        iVar12 = 0;
        while( true ) {
          iVar13 = InputGraph::size(second);
          if (iVar13 <= iVar12) break;
          InputGraph::vertex_name_abi_cxx11_((string *)&assoc_encoding,first,iVar24);
          permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               &(assoc_encoding.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->first;
          permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(permitted.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,iVar24);
          if (assoc_encoding.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start == (pointer)pppVar1) {
            aStack_f0._8_8_ = uStack_220;
            assoc_encoding.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)&aStack_f0;
          }
          aStack_f0._M_allocated_capacity._1_7_ =
               assoc_encoding.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_;
          aStack_f0._M_local_buf[0] =
               assoc_encoding.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_;
          assoc_encoding.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          assoc_encoding.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = &(assoc_encoding.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first;
          assoc_encoding.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pppVar1;
          InputGraph::vertex_name_abi_cxx11_((string *)&zero_in_proof_objectives,second,iVar12);
          clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)
               zero_in_proof_objectives.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               &clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          clique_result.clique._M_t._M_impl._0_4_ = iVar12;
          if (zero_in_proof_objectives.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start == (pointer)pppVar2) {
            clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)uStack_190;
          }
          else {
            clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 zero_in_proof_objectives.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)
               CONCAT71(zero_in_proof_objectives.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                        zero_in_proof_objectives.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
          zero_in_proof_objectives.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          zero_in_proof_objectives.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          domains.partitions.
          super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)domains.partitions.
                                super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
          zero_in_proof_objectives.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pppVar2;
          std::
          vector<std::tuple<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,bool>,std::allocator<std::tuple<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,bool>>>
          ::
          emplace_back<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,bool>
                    ((vector<std::tuple<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,bool>,std::allocator<std::tuple<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,bool>>>
                      *)&solution,
                     (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&permitted,
                     (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&clique_result,(bool *)&domains);
          std::__cxx11::string::~string
                    ((string *)&clique_result.clique._M_t._M_impl.super__Rb_tree_header);
          std::__cxx11::string::~string((string *)&zero_in_proof_objectives);
          std::__cxx11::string::~string
                    ((string *)
                     &permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
          std::__cxx11::string::~string((string *)&assoc_encoding);
          iVar12 = iVar12 + 1;
        }
        iVar24 = iVar24 + 1;
      }
      innards::Proof::new_incumbent
                (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &solution);
      peVar6 = proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar24 = InputGraph::size(first);
      innards::Proof::rewrite_mcs_objective(peVar6,iVar24);
      std::
      vector<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
      ::~vector(&solution);
    }
  }
  if (params->clique == true) {
    aStack_f0._M_local_buf[4] = 0;
    aStack_f0._M_local_buf[0xc] = 0;
    local_e0 = (__uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>)
               0x0;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._8_16_ =
         ZEXT816(0);
    local_d8._M_allocated_capacity = 0x1ffffffff;
    local_d8._M_local_buf[8] = '\0';
    _local_c8 = (function<gss::innards::SVOBitset_(int,_const_std::function<int_(int)>_&)>)
                ZEXT1632(ZEXT816(0) << 0x40);
    local_60 = false;
    local_44._M_engaged = false;
    local_58._M_ptr = (element_type *)0x0;
    local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48 = false;
    std::__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2> *)&permitted,
               (__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2> *)params);
    aStack_f0._M_allocated_capacity =
         (size_type)
         (params->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)(params->start_time).__d.__r;
    std::make_unique<gss::NoRestartsSchedule>();
    uVar4 = local_e0;
    local_e0 = clique_result.clique._M_t._M_impl._0_8_;
    clique_result.clique._M_t._M_impl._0_8_ = 0;
    if ((_Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>)
        uVar4 != (RestartsSchedule *)0x0) {
      (**(code **)(*(long *)uVar4 + 8))();
    }
    std::unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>::
    ~unique_ptr((unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>
                 *)&clique_result);
    uVar16 = InputGraph::size(first);
    local_44 = (_Optional_payload_base<int>)((ulong)uVar16 | 0x100000000);
    iVar24 = 0;
    InputGraph::InputGraph((InputGraph *)&solution,0,false,false);
    assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    zero_in_proof_objectives.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    zero_in_proof_objectives.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    zero_in_proof_objectives.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    zero_in_proof_objectives.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      clique_result.clique._M_t._M_impl._0_4_ = iVar24;
      iVar12 = InputGraph::size(first);
      if (iVar12 <= iVar24) break;
      iVar24 = 0;
      while( true ) {
        domains.partitions.
        super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(domains.partitions.
                               super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar24);
        iVar12 = InputGraph::size(second);
        if (iVar12 <= iVar24) break;
        bVar9 = InputGraph::adjacent
                          (first,clique_result.clique._M_t._M_impl._0_4_,
                           clique_result.clique._M_t._M_impl._0_4_);
        bVar10 = InputGraph::adjacent
                           (second,(int)domains.partitions.
                                        super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                            (int)domains.partitions.
                                 super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        if (bVar9 == bVar10) {
          sVar26 = InputGraph::vertex_label(first,clique_result.clique._M_t._M_impl._0_4_);
          sVar27 = InputGraph::vertex_label
                             (second,(int)domains.partitions.
                                          super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
          bVar9 = std::operator==(sVar26,sVar27);
          this_00 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&assoc_encoding
          ;
          if (!bVar9) goto LAB_001139f3;
LAB_001139fe:
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int&,int&>(this_00,(int *)&clique_result,(int *)&domains);
        }
        else {
LAB_001139f3:
          this_00 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                    &zero_in_proof_objectives;
          if (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) goto LAB_001139fe;
        }
        iVar24 = (int)domains.partitions.
                      super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      iVar24 = clique_result.clique._M_t._M_impl._0_4_ + 1;
    }
    if (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      innards::Proof::create_clique_encoding
                (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &assoc_encoding,&zero_in_proof_objectives);
    }
    InputGraph::resize((InputGraph *)&solution,
                       (int)((ulong)((long)assoc_encoding.
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    CONCAT44(assoc_encoding.
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (int)assoc_encoding.
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)) >> 3))
    ;
    lVar19 = CONCAT44(assoc_encoding.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      (int)assoc_encoding.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    ppVar22 = assoc_encoding.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish;
    for (uVar16 = 0; (ulong)uVar16 < (ulong)((long)ppVar22 - lVar19 >> 3); uVar16 = uVar16 + 1) {
      for (b = 0; (ulong)b < (ulong)((long)ppVar22 - lVar19 >> 3); b = b + 1) {
        if (uVar16 != b) {
          uVar4 = *(undefined8 *)(lVar19 + (ulong)b * 8);
          uVar5 = *(undefined8 *)(lVar19 + (ulong)uVar16 * 8);
          iVar12 = (int)uVar5;
          iVar24 = (int)uVar4;
          if (iVar12 != iVar24) {
            iVar13 = (int)((ulong)uVar5 >> 0x20);
            iVar14 = (int)((ulong)uVar4 >> 0x20);
            if (iVar13 != iVar14) {
              bVar9 = InputGraph::adjacent(first,iVar12,iVar24);
              bVar10 = InputGraph::adjacent(second,iVar13,iVar14);
              if (bVar9 == bVar10) {
                bVar9 = InputGraph::adjacent(first,iVar12,iVar24);
                if (bVar9) {
                  sVar26 = InputGraph::edge_label(first,iVar12,iVar24);
                  sVar27 = InputGraph::edge_label(second,iVar13,iVar14);
                  bVar9 = std::operator==(sVar26,sVar27);
                  if (!bVar9) goto LAB_00113d22;
                }
                InputGraph::add_edge((InputGraph *)&solution,uVar16,b);
                goto LAB_00113d9a;
              }
            }
          }
LAB_00113d22:
          if (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            innards::Proof::create_clique_nonedge
                      (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,uVar16,b);
          }
        }
LAB_00113d9a:
        lVar19 = CONCAT44(assoc_encoding.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)assoc_encoding.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        ppVar22 = assoc_encoding.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    std::__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_58,&proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>)
    ;
    fVar8 = _local_c8;
    if (params->connected != false) {
      clique_result.clique._M_t._M_impl._0_8_ = local_c8._0_8_;
      clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_c8._8_8_;
      local_c8._8_8_ = first;
      local_c8._0_8_ = &assoc_encoding;
      p_Stack_b8 = fVar8.super__Function_base._M_manager;
      clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Stack_b8;
      p_Stack_b0 = (_Base_ptr)fVar8._M_invoker;
      clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Stack_b0;
      p_Stack_b8 = (_Base_ptr)
                   std::
                   _Function_handler<gss::innards::SVOBitset_(int,_const_std::function<int_(int)>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/common_subgraph.cc:462:39)>
                   ::_M_manager;
      p_Stack_b0 = (_Base_ptr)
                   std::
                   _Function_handler<gss::innards::SVOBitset_(int,_const_std::function<int_(int)>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/common_subgraph.cc:462:39)>
                   ::_M_invoke;
      std::_Function_base::~_Function_base((_Function_base *)&clique_result);
    }
    solve_clique_problem(&clique_result,(InputGraph *)&solution,(CliqueParams *)&permitted);
    CommonSubgraphResult::CommonSubgraphResult(__return_storage_ptr__);
    for (p_Var20 = clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var20 != &clique_result.clique._M_t._M_impl.super__Rb_tree_header;
        p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_emplace_unique<std::pair<int,int>&>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)__return_storage_ptr__,
                 (pair<int,_int> *)
                 ((long)(int)p_Var20[1]._M_color * 8 +
                 CONCAT44(assoc_encoding.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)assoc_encoding.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)));
    }
    __return_storage_ptr__->nodes = clique_result.nodes;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&__return_storage_ptr__->extra_stats);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[26]>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->extra_stats,(char (*) [26])"used_clique_solver = true");
    __return_storage_ptr__->complete = clique_result.complete;
    CliqueResult::~CliqueResult(&clique_result);
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&zero_in_proof_objectives.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&assoc_encoding.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
    InputGraph::~InputGraph((InputGraph *)&solution);
    CliqueParams::~CliqueParams((CliqueParams *)&permitted);
    goto LAB_00114081;
  }
  __args = &proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>;
  solution.
  super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)first;
  solution.
  super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)second;
  solution.
  super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)params;
  std::__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1e0,__args);
  CommonSubgraphResult::CommonSubgraphResult(__return_storage_ptr__);
  p_Var3 = &clique_result.clique._M_t._M_impl.super__Rb_tree_header;
  clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar24 = 0;
  clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  while (assoc_encoding.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start._0_4_ = iVar24,
        iVar12 = InputGraph::size((InputGraph *)
                                  solution.
                                  super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start), iVar24 < iVar12) {
    bVar9 = InputGraph::adjacent
                      ((InputGraph *)
                       solution.
                       super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (int)assoc_encoding.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                       (int)assoc_encoding.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._8_16_ =
         InputGraph::vertex_label
                   ((InputGraph *)
                    solution.
                    super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (int)assoc_encoding.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT71(permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,bVar9);
    pmVar18 = std::
              map<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
              ::operator[]((map<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                            *)&clique_result,(key_type *)&permitted);
    __args = (__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> *)&assoc_encoding;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)pmVar18,
               (int *)&assoc_encoding);
    iVar24 = (int)assoc_encoding.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1;
  }
  iVar24 = 0;
  while (assoc_encoding.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start._0_4_ = iVar24,
        iVar12 = InputGraph::size((InputGraph *)
                                  solution.
                                  super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish), iVar24 < iVar12) {
    bVar9 = InputGraph::adjacent
                      ((InputGraph *)
                       solution.
                       super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (int)assoc_encoding.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                       (int)assoc_encoding.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._8_16_ =
         InputGraph::vertex_label
                   ((InputGraph *)
                    solution.
                    super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (int)assoc_encoding.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT71(permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,bVar9);
    pmVar18 = std::
              map<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
              ::operator[]((map<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                            *)&clique_result,(key_type *)&permitted);
    __args = (__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> *)&assoc_encoding;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &pmVar18->second,(int *)&assoc_encoding);
    iVar24 = (int)assoc_encoding.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1;
  }
  domains.partitions.
  super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  domains.partitions.
  super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  domains.partitions.
  super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var20 = clique_result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var20 != p_Var3; p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
    if ((*(long *)(p_Var20 + 3) != 0) && (p_Var20[4]._M_left != (_Base_ptr)0x0)) {
      __args = (__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> *)&p_Var20[1]._M_right
      ;
      std::
      vector<std::pair<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>>>
      ::
      emplace_back<std::set<int,std::less<int>,std::allocator<int>>&,std::set<int,std::less<int>,std::allocator<int>>&>
                ((vector<std::pair<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>>>
                  *)&domains,(set<int,_std::less<int>,_std::allocator<int>_> *)__args,
                 (set<int,_std::less<int>,_std::allocator<int>_> *)&p_Var20[3]._M_parent);
    }
  }
  assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  zero_in_proof_objectives.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  zero_in_proof_objectives.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  zero_in_proof_objectives.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  bVar11 = *(byte *)((long)&((solution.
                              super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super__Tuple_impl<0UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                            ).
                            super__Tuple_impl<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                            .
                            super__Head_base<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_head_impl.second._M_string_length + 4);
  zero_in_proof_objectives.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       assoc_encoding.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar11 == 1) {
    iVar24 = -1;
    for (uVar16 = 1;
        uVar16 <= (int)((solution.
                         super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                       super__Tuple_impl<0UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                       ).
                       super__Tuple_impl<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                       .
                       super__Head_base<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                       ._M_head_impl.second._M_string_length - 1U; uVar16 = uVar16 + 1) {
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,iVar24);
      __args = (__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> *)&permitted;
      local_1ac = iVar24;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 &zero_in_proof_objectives,(int *)&permitted,&local_1ac);
      iVar24 = iVar24 + -1;
    }
    bVar11 = *(byte *)((long)&((solution.
                                super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                              super__Tuple_impl<0UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                              ).
                              super__Tuple_impl<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                              .
                              super__Head_base<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                              ._M_head_impl.second._M_string_length + 4);
  }
  ptVar7 = solution.
           super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (((bVar11 & 1) == 0) ||
     (uVar16 = anon_unknown.dwarf_5636c::CommonSubgraphRunner::bound
                         ((CommonSubgraphRunner *)&domains,(SplitDomains *)__args),
     (uint)(ptVar7->
           super__Tuple_impl<0UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
           ).
           super__Tuple_impl<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
           .
           super__Head_base<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
           ._M_head_impl.second._M_string_length <= uVar16)) {
    local_d8._M_allocated_capacity = local_d8._M_allocated_capacity & 0xffffffffffffff00;
    SVar17 = anon_unknown.dwarf_5636c::CommonSubgraphRunner::search
                       ((CommonSubgraphRunner *)&solution,0,(Assignments *)&assoc_encoding,
                        (Assignments *)&zero_in_proof_objectives,&domains,
                        &__return_storage_ptr__->nodes,&__return_storage_ptr__->solution_count,
                        (optional<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)&permitted
                       );
    std::_Optional_payload_base<std::set<int,_std::less<int>,_std::allocator<int>_>_>::_M_reset
              ((_Optional_payload_base<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
               &permitted);
    ppVar22 = zero_in_proof_objectives.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish;
    if (SVar17 == Complete) {
      __return_storage_ptr__->complete = true;
      ppVar25 = zero_in_proof_objectives.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (*(char *)((long)&((solution.
                             super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super__Tuple_impl<0UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                           ).
                           super__Tuple_impl<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                           .
                           super__Head_base<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                           ._M_head_impl.second._M_string_length + 4) == '\0') {
        for (; ppVar25 != ppVar22; ppVar25 = ppVar25 + 1) {
          std::
          _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
          ::_M_emplace_unique<int&,int&>
                    ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                      *)__return_storage_ptr__,&ppVar25->first,&ppVar25->second);
        }
      }
    }
    else if (SVar17 == DecidedTrue) {
      __return_storage_ptr__->complete = true;
      for (ppVar25 = zero_in_proof_objectives.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppVar25 != ppVar22;
          ppVar25 = ppVar25 + 1) {
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_emplace_unique<int&,int&>
                  ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                    *)__return_storage_ptr__,&ppVar25->first,&ppVar25->second);
      }
    }
    else if (SVar17 == SatisfiableButKeepGoing) {
      __return_storage_ptr__->complete = true;
    }
LAB_00113ff9:
    if (local_1e0._M_ptr != (Proof *)0x0) {
      if (*(char *)((long)&((solution.
                             super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super__Tuple_impl<0UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                           ).
                           super__Tuple_impl<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                           .
                           super__Head_base<1UL,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                           ._M_head_impl.second._M_string_length + 4) == '\x01') {
        if ((__return_storage_ptr__->complete != false) &&
           ((__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
           ) {
          innards::Proof::finish_unsat_proof(local_1e0._M_ptr);
        }
      }
      else if (__return_storage_ptr__->complete != false) {
        iVar24 = InputGraph::size((InputGraph *)
                                  solution.
                                  super__Vector_base<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
        innards::Proof::finish_optimisation_proof
                  (local_1e0._M_ptr,
                   iVar24 - (int)(__return_storage_ptr__->mapping)._M_t._M_impl.
                                 super__Rb_tree_header._M_node_count);
      }
    }
  }
  else {
    __return_storage_ptr__->complete = true;
    if (local_1e0._M_ptr != (Proof *)0x0) {
      innards::Proof::mcs_bound(local_1e0._M_ptr,&domains.partitions);
      goto LAB_00113ff9;
    }
  }
  anon_unknown.dwarf_5636c::Assignments::~Assignments((Assignments *)&zero_in_proof_objectives);
  anon_unknown.dwarf_5636c::Assignments::~Assignments((Assignments *)&assoc_encoding);
  std::
  vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~vector(&domains.partitions);
  std::
  _Rb_tree<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::_Select1st<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::less<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::_Select1st<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::less<std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<bool,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
               *)&clique_result);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0._M_refcount);
LAB_00114081:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return __return_storage_ptr__;
}

Assistant:

auto gss::solve_common_subgraph_problem(const InputGraph & first, const InputGraph & second,
    const CommonSubgraphParams & params) -> CommonSubgraphResult
{
    if (params.count_solutions && ! params.decide)
        throw UnsupportedConfiguration{"Solution counting only makes sense for decision problems"};

    shared_ptr<Proof> proof;
    if (params.proof_options) {
        proof = make_shared<Proof>(*params.proof_options);

        for (int n = 0; n < first.size(); ++n) {
            proof->create_cp_variable(
                n, second.size() + 1,
                [&](int v) { return first.vertex_name(v); },
                [&](int v) { if (v == second.size()) return string("null"); else return second.vertex_name(v); });
        }

        proof->create_null_decision_bound(first.size(), second.size(), params.decide);

        // generate constraints for injectivity
        proof->create_injectivity_constraints(first.size(), second.size());

        // generate edge constraints, and also handle loops here
        for (int p = 0; p < first.size(); ++p) {
            for (int t = 0; t < second.size(); ++t) {
                if (first.adjacent(p, p) != second.adjacent(t, t))
                    proof->create_forbidden_assignment_constraint(p, t);
                else if (first.vertex_label(p) != second.vertex_label(t))
                    proof->create_forbidden_assignment_constraint(p, t);
                else {
                    proof->start_adjacency_constraints_for(p, t);

                    // if p can be mapped to t, then each (non-)neighbour of p...
                    for (int q = 0; q < first.size(); ++q)
                        if (q != p) {
                            // ... must be mapped to a (non-)neighbour of t
                            vector<int> permitted;
                            for (int u = 0; u < second.size(); ++u)
                                if (t != u && first.adjacent(p, q) == second.adjacent(t, u))
                                    permitted.push_back(u);
                            // or null
                            permitted.push_back(second.size());
                            proof->create_adjacency_constraint(p, q, t, permitted, vector<int>{}, false);
                        }
                }
            }
        }

        if (params.connected)
            proof->create_connected_constraints(first.size(), second.size(), [&](int a, int b) { return first.adjacent(a, b); });

        // output the model file
        proof->finalise_model();

        // rewrite the objective to the form we need
        if (! params.decide) {
            vector<tuple<NamedVertex, NamedVertex, bool>> solution;
            for (int v = 0; v < first.size(); ++v)
                for (int w = 0; w < second.size(); ++w)
                    solution.emplace_back(
                        NamedVertex{v, first.vertex_name(v)},
                        NamedVertex{w, second.vertex_name(w)},
                        false);
            proof->new_incumbent(solution);
            proof->rewrite_mcs_objective(first.size());
        }
    }

    if (params.clique) {
        CliqueParams clique_params;
        clique_params.timeout = params.timeout;
        clique_params.start_time = params.start_time;
        clique_params.decide = params.decide;
        clique_params.restarts_schedule = make_unique<NoRestartsSchedule>();
        clique_params.adjust_objective_for_mcs = make_optional(first.size());

        InputGraph assoc{0, false, false};
        vector<pair<int, int>> assoc_encoding, zero_in_proof_objectives;

        for (int v = 0; v < first.size(); ++v)
            for (int w = 0; w < second.size(); ++w)
                if ((first.adjacent(v, v) == second.adjacent(w, w)) && (first.vertex_label(v) == second.vertex_label(w)))
                    assoc_encoding.emplace_back(v, w);
                else if (proof)
                    zero_in_proof_objectives.emplace_back(v, w);

        if (proof)
            proof->create_clique_encoding(assoc_encoding, zero_in_proof_objectives);

        assoc.resize(assoc_encoding.size());
        for (unsigned v = 0; v < assoc_encoding.size(); ++v)
            for (unsigned w = 0; w < assoc_encoding.size(); ++w)
                if (v != w) {
                    auto [vf, vs] = assoc_encoding[v];
                    auto [wf, ws] = assoc_encoding[w];
                    bool edge = false;
                    if (vf != wf && vs != ws && first.adjacent(vf, wf) == second.adjacent(vs, ws)) {
                        if ((! first.adjacent(vf, wf)) || (first.edge_label(vf, wf) == second.edge_label(vs, ws))) {
                            edge = true;
                            assoc.add_edge(v, w);
                        }
                    }

                    if (proof && ! edge)
                        proof->create_clique_nonedge(v, w);
                }

        clique_params.extend_proof = proof;

        if (params.connected) {
            clique_params.connected = [&](int x, const function<auto(int)->int> & invorder) -> SVOBitset {
                auto [f, _] = assoc_encoding[x];
                SVOBitset v(assoc_encoding.size(), 0);
                v.reset();
                for (unsigned y = 0; y < assoc_encoding.size(); ++y)
                    if (first.adjacent(f, assoc_encoding[y].first))
                        v.set(invorder(y));
                return v;
            };
        }

        auto clique_result = solve_clique_problem(assoc, clique_params);

        // now translate the result back into what we expect
        CommonSubgraphResult result;
        for (auto & m : clique_result.clique)
            result.mapping.emplace(assoc_encoding[m]);
        result.nodes = clique_result.nodes;
        result.extra_stats = move(clique_result.extra_stats);
        result.extra_stats.emplace_back("used_clique_solver = true");
        result.complete = clique_result.complete;

        return result;
    }
    else {
        CommonSubgraphRunner runner{first, second, params, proof};
        return runner.run();
    }
}